

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O3

void LoadSectors(sectortype *bsec)

{
  extsector_t *__s;
  int *piVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  FTextureID FVar7;
  FDynamicColormap *pFVar8;
  ulong uVar9;
  size_t __n;
  sector_t *this;
  ulong *puVar10;
  int iVar11;
  BYTE *pBVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined4 uVar18;
  char tnam [9];
  char local_39 [9];
  
  pFVar8 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.fadeto,0);
  iVar11 = numsectors;
  uVar17 = (ulong)numsectors;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar17;
  uVar9 = SUB168(auVar5 * ZEXT816(0xb0),0);
  uVar13 = uVar9 | 8;
  if (SUB168(auVar5 * ZEXT816(0xb0),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar17;
  __n = SUB168(auVar6 * ZEXT816(0x268),0);
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x268),8) == 0) {
    uVar15 = __n;
  }
  this = (sector_t *)operator_new__(uVar15);
  sectors = this;
  memset(this,0,__n);
  puVar10 = (ulong *)operator_new__(uVar13);
  __s = (extsector_t *)(puVar10 + 1);
  *puVar10 = uVar17;
  if (iVar11 == 0) {
    this->e = __s;
  }
  else {
    memset(__s,0,((uVar9 - 0xb0) / 0xb0) * 0xb0 + 0xb0);
    this->e = __s;
    if (0 < iVar11) {
      pBVar12 = &bsec->floorypanning;
      lVar14 = 0;
      lVar16 = 0;
      do {
        this->e = (extsector_t *)((long)&(sectors->e->FakeFloor).Sectors.Array + lVar14);
        iVar11 = *(int *)(pBVar12 + -0x17);
        this->planes[0].TexZ = (double)-iVar11 * 0.00390625;
        (this->floorplane).normal.X = 0.0;
        (this->floorplane).normal.Y = 0.0;
        (this->floorplane).normal.Z = 1.0;
        (this->floorplane).negiC = -1.0;
        (this->floorplane).D = -((double)-iVar11 * 0.00390625);
        mysnprintf(local_39,9,"BTIL%04d");
        FVar7 = FTextureManager::GetTexture(&TexMan,local_39,5,0);
        iVar11 = this->planes[0].Texture.texnum;
        this->planes[0].Texture.texnum = FVar7.texnum;
        if (iVar11 != FVar7.texnum) {
          sector_t::AdjustFloorClip(this);
        }
        dVar2 = *(double *)(&DAT_007651f0 + (ulong)((*(ushort *)(pBVar12 + -0x11) & 8) == 0) * 8);
        this->planes[0].xform.xScale = dVar2;
        this->planes[0].xform.yScale = dVar2;
        this->planes[0].xform.xOffs = (double)pBVar12[-1] + 32.0;
        this->planes[0].xform.yOffs = (double)*pBVar12;
        this->planes[0].Light = (char)pBVar12[-3] * -2 + 0xff;
        piVar1 = &this->planes[0].Flags;
        *(byte *)piVar1 = (byte)*piVar1 | 1;
        iVar11 = *(int *)(pBVar12 + -0x1b);
        this->planes[1].TexZ = (double)-iVar11 * 0.00390625;
        (this->ceilingplane).normal.X = 0.0;
        (this->ceilingplane).normal.Y = 0.0;
        (this->ceilingplane).normal.Z = -1.0;
        (this->ceilingplane).negiC = 1.0;
        (this->ceilingplane).D = (double)-iVar11 * 0.00390625;
        mysnprintf(local_39,9,"BTIL%04d");
        FVar7 = FTextureManager::GetTexture(&TexMan,local_39,5,0);
        this->planes[1].Texture.texnum = FVar7.texnum;
        uVar3 = *(ushort *)(pBVar12 + -0x13);
        if ((uVar3 & 1) != 0) {
          sky1texture = FVar7;
          sky2texture = FVar7;
          this->planes[1].Texture.texnum = skyflatnum.texnum;
        }
        dVar2 = *(double *)(&DAT_007651f0 + (ulong)((uVar3 & 8) == 0) * 8);
        this->planes[1].xform.xScale = dVar2;
        this->planes[1].xform.yScale = dVar2;
        this->planes[1].xform.xOffs = (double)pBVar12[-9] + 32.0;
        this->planes[1].xform.yOffs = (double)pBVar12[-8];
        iVar11 = (char)pBVar12[-0xb] * -2 + 0xff;
        this->planes[1].Light = iVar11;
        piVar1 = &this->planes[1].Flags;
        *(byte *)piVar1 = (byte)*piVar1 | 1;
        iVar11 = iVar11 + this->planes[0].Light;
        this->lightlevel = (short)((uint)(iVar11 - (iVar11 >> 0x1f)) >> 1);
        this->seqType = -1;
        (this->SeqName).super_FName.Index = 0;
        this->prevsec = -1;
        this->nextsec = -1;
        this->gravity = 1.0;
        this->friction = 0.90625;
        this->movefactor = 0.03125;
        this->ColorMap = pFVar8;
        this->ZoneNumber = 0xffff;
        this->terrainnum[0] = -1;
        this->terrainnum[1] = -1;
        uVar4 = *(ushort *)(pBVar12 + -0x11);
        if ((uVar4 & 4) != 0) {
          this->planes[0].xform.Angle.Degrees = 90.0;
          this->planes[0].xform.xScale = -this->planes[0].xform.xScale;
        }
        if ((uVar4 & 0x10) != 0) {
          this->planes[0].xform.xScale = -this->planes[0].xform.xScale;
        }
        if ((uVar4 & 0x20) != 0) {
          this->planes[0].xform.yScale = -this->planes[0].xform.yScale;
        }
        uVar18 = (undefined4)((ulong)dVar2 >> 0x20);
        if ((uVar3 & 4) != 0) {
          this->planes[1].xform.Angle.Degrees = 90.0;
          uVar18 = (undefined4)((ulong)-dVar2 >> 0x20);
          this->planes[1].xform.yScale = -dVar2;
        }
        if ((uVar3 & 0x10) != 0) {
          this->planes[1].xform.xScale = -dVar2;
        }
        if ((uVar3 & 0x20) != 0) {
          this->planes[1].xform.yScale = -(double)CONCAT44(uVar18,SUB84(dVar2,0));
        }
        lVar16 = lVar16 + 1;
        this = this + 1;
        lVar14 = lVar14 + 0xb0;
        pBVar12 = pBVar12 + 0x28;
      } while (lVar16 < numsectors);
    }
  }
  return;
}

Assistant:

static void LoadSectors (sectortype *bsec)
{
	FDynamicColormap *map = GetSpecialLights (PalEntry (255,255,255), level.fadeto, 0);
	sector_t *sec;
	char tnam[9];

	sec = sectors = new sector_t[numsectors];
	memset (sectors, 0, sizeof(sector_t)*numsectors);

	sectors[0].e = new extsector_t[numsectors];

	for (int i = 0; i < numsectors; ++i, ++bsec, ++sec)
	{
		bsec->wallptr = WORD(bsec->wallptr);
		bsec->wallnum = WORD(bsec->wallnum);
		bsec->ceilingstat = WORD(bsec->ceilingstat);
		bsec->floorstat = WORD(bsec->floorstat);

		sec->e = &sectors[0].e[i];
		double floorheight = -LittleLong(bsec->floorZ) / 256.;
		sec->SetPlaneTexZ(sector_t::floor, floorheight);
		sec->floorplane.SetAtHeight(floorheight, sector_t::floor);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(bsec->floorpicnum));
		sec->SetTexture(sector_t::floor, TexMan.GetTexture (tnam, FTexture::TEX_Build));
		sec->SetXScale(sector_t::floor, (bsec->floorstat & 8) ? 2. : 1.);
		sec->SetYScale(sector_t::floor, (bsec->floorstat & 8) ? 2. : 1.);
		sec->SetXOffset(sector_t::floor, bsec->floorxpanning + 32.);
		sec->SetYOffset(sector_t::floor, bsec->floorypanning + 0.);
		sec->SetPlaneLight(sector_t::floor, SHADE2LIGHT (bsec->floorshade));
		sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);

		double ceilingheight = -LittleLong(bsec->ceilingZ) / 256.;
		sec->SetPlaneTexZ(sector_t::ceiling, ceilingheight);
		sec->ceilingplane.SetAtHeight(ceilingheight, sector_t::ceiling);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(bsec->ceilingpicnum));
		sec->SetTexture(sector_t::ceiling, TexMan.GetTexture (tnam, FTexture::TEX_Build));
		if (bsec->ceilingstat & 1)
		{
			sky1texture = sky2texture = sec->GetTexture(sector_t::ceiling);
			sec->SetTexture(sector_t::ceiling, skyflatnum);
		}
		sec->SetXScale(sector_t::ceiling, (bsec->ceilingstat & 8) ? 2. : 1.);
		sec->SetYScale(sector_t::ceiling, (bsec->ceilingstat & 8) ? 2. : 1.);
		sec->SetXOffset(sector_t::ceiling, bsec->ceilingxpanning + 32.);
		sec->SetYOffset(sector_t::ceiling, bsec->ceilingypanning + 0.);
		sec->SetPlaneLight(sector_t::ceiling, SHADE2LIGHT (bsec->ceilingshade));
		sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);

		sec->lightlevel = (sec->GetPlaneLight(sector_t::floor) + sec->GetPlaneLight(sector_t::ceiling)) / 2;

		sec->seqType = -1;
		sec->SeqName = NAME_None;
		sec->nextsec = -1;
		sec->prevsec = -1;
		sec->gravity = 1.f;
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;
		sec->ColorMap = map;
		sec->ZoneNumber = 0xFFFF;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;

		if (bsec->floorstat & 4)
		{
			sec->SetAngle(sector_t::floor, DAngle(90.));
			sec->SetXScale(sector_t::floor, -sec->GetXScale(sector_t::floor));
		}
		if (bsec->floorstat & 16)
		{
			sec->SetXScale(sector_t::floor, -sec->GetXScale(sector_t::floor));
		}
		if (bsec->floorstat & 32)
		{
			sec->SetYScale(sector_t::floor, -sec->GetYScale(sector_t::floor));
		}

		if (bsec->ceilingstat & 4)
		{
			sec->SetAngle(sector_t::ceiling, DAngle(90.));
			sec->SetYScale(sector_t::ceiling, -sec->GetYScale(sector_t::ceiling));
		}
		if (bsec->ceilingstat & 16)
		{
			sec->SetXScale(sector_t::ceiling, -sec->GetXScale(sector_t::ceiling));
		}
		if (bsec->ceilingstat & 32)
		{
			sec->SetYScale(sector_t::ceiling, -sec->GetYScale(sector_t::ceiling));
		}
	}
}